

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

char * VW::are_features_compatible(vw *vw1,vw *vw2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first2;
  bool bVar1;
  parser *__first2_00;
  pointer __rhs;
  char *pcVar2;
  pointer __lhs;
  
  __first2_00 = vw2->p;
  if (vw1->p->hasher == __first2_00->hasher) {
    bVar1 = std::__equal<true>::equal<bool>
                      (vw1->spelling_features,(bool *)&vw1->dictionary_path,vw2->spelling_features);
    if (bVar1) {
      bVar1 = std::__equal<true>::equal<unsigned_long>
                        ((__equal<true> *)vw1->affix_features,
                         (unsigned_long *)
                         &vw1->namespace_dictionaries[0x49].
                          super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,vw2->affix_features,
                         (unsigned_long *)__first2_00);
      if (bVar1) {
        bVar1 = std::__equal<true>::equal<unsigned_int>
                          ((__equal<true> *)vw1->ngram,vw1->skips,vw2->ngram,(uint *)__first2_00);
        if (bVar1) {
          bVar1 = std::__equal<true>::equal<unsigned_int>
                            ((__equal<true> *)vw1->skips,(uint *)&vw1->limit_strings,vw2->skips,
                             (uint *)__first2_00);
          if (bVar1) {
            bVar1 = std::__equal<true>::equal<unsigned_int>
                              ((__equal<true> *)vw1->limit,(uint *)vw1->affix_features,vw2->limit,
                               (uint *)__first2_00);
            if (bVar1) {
              if (vw1->num_bits == vw2->num_bits) {
                if (vw1->permutations == vw2->permutations) {
                  if ((long)(vw1->interactions).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(vw1->interactions).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start ==
                      (long)(vw2->interactions).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(vw2->interactions).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) {
                    if (vw1->ignore_some == vw2->ignore_some) {
                      if ((vw1->ignore_some != false) &&
                         (bVar1 = std::__equal<true>::equal<bool>
                                            (vw1->ignore,&vw1->ignore_some_linear,vw2->ignore),
                         !bVar1)) {
                        return "ignore";
                      }
                      if (vw1->ignore_some_linear == vw2->ignore_some_linear) {
                        if ((vw1->ignore_some_linear != false) &&
                           (bVar1 = std::__equal<true>::equal<bool>
                                              (vw1->ignore_linear,&vw1->redefine_some,
                                               vw2->ignore_linear), !bVar1)) {
                          return "ignore_linear";
                        }
                        if (vw1->redefine_some == vw2->redefine_some) {
                          if ((vw1->redefine_some != false) &&
                             (bVar1 = std::__equal<true>::equal<unsigned_char>
                                                (vw1->redefine,&vw1->field_0x6b3,vw2->redefine),
                             !bVar1)) {
                            return "redefine";
                          }
                          if (vw1->add_constant == vw2->add_constant) {
                            __first1 = (vw1->dictionary_path).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                            __last1 = (vw1->dictionary_path).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish;
                            __first2 = (vw2->dictionary_path).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                            if ((long)__last1 - (long)__first1 ==
                                (long)(vw2->dictionary_path).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)__first2) {
                              bVar1 = std::__equal<false>::
                                      equal<std::__cxx11::string*,std::__cxx11::string*>
                                                (__first1,__last1,__first2);
                              if (bVar1) {
                                __rhs = (vw2->interactions).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                                for (__lhs = (vw1->interactions).
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start;
                                    __lhs != (vw1->interactions).
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish;
                                    __lhs = __lhs + 1) {
                                  bVar1 = std::operator!=(__lhs,__rhs);
                                  if (bVar1) {
                                    return "interaction mismatch";
                                  }
                                  __rhs = __rhs + 1;
                                }
                                pcVar2 = (char *)0x0;
                              }
                              else {
                                pcVar2 = "dictionary_path";
                              }
                            }
                            else {
                              pcVar2 = "dictionary_path size";
                            }
                          }
                          else {
                            pcVar2 = "add_constant";
                          }
                        }
                        else {
                          pcVar2 = "redefine_some";
                        }
                      }
                      else {
                        pcVar2 = "ignore_some_linear";
                      }
                    }
                    else {
                      pcVar2 = "ignore_some";
                    }
                  }
                  else {
                    pcVar2 = "interactions size";
                  }
                }
                else {
                  pcVar2 = "permutations";
                }
              }
              else {
                pcVar2 = "num_bits";
              }
            }
            else {
              pcVar2 = "limit";
            }
          }
          else {
            pcVar2 = "skips";
          }
        }
        else {
          pcVar2 = "ngram";
        }
      }
      else {
        pcVar2 = "affix_features";
      }
    }
    else {
      pcVar2 = "spelling_features";
    }
  }
  else {
    pcVar2 = "hasher";
  }
  return pcVar2;
}

Assistant:

const char* are_features_compatible(vw& vw1, vw& vw2)
{
  if (vw1.p->hasher != vw2.p->hasher)
    return "hasher";

  if (!equal(vw1.spelling_features, vw1.spelling_features + (sizeof(vw1.spelling_features) / sizeof(bool)),
          vw2.spelling_features))
    return "spelling_features";

  if (!equal(
          vw1.affix_features, vw1.affix_features + (sizeof(vw1.affix_features) / sizeof(uint32_t)), vw2.affix_features))
    return "affix_features";

  if (!equal(vw1.ngram, vw1.ngram + (sizeof(vw1.ngram) / sizeof(uint32_t)), vw2.ngram))
    return "ngram";

  if (!equal(vw1.skips, vw1.skips + (sizeof(vw1.skips) / sizeof(uint32_t)), vw2.skips))
    return "skips";

  if (!equal(vw1.limit, vw1.limit + (sizeof(vw1.limit) / sizeof(uint32_t)), vw2.limit))
    return "limit";

  if (vw1.num_bits != vw2.num_bits)
    return "num_bits";

  if (vw1.permutations != vw2.permutations)
    return "permutations";

  if (vw1.interactions.size() != vw2.interactions.size())
    return "interactions size";

  if (vw1.ignore_some != vw2.ignore_some)
    return "ignore_some";

  if (vw1.ignore_some && !equal(vw1.ignore, vw1.ignore + (sizeof(vw1.ignore) / sizeof(bool)), vw2.ignore))
    return "ignore";

  if (vw1.ignore_some_linear != vw2.ignore_some_linear)
    return "ignore_some_linear";

  if (vw1.ignore_some_linear &&
      !equal(vw1.ignore_linear, vw1.ignore_linear + (sizeof(vw1.ignore_linear) / sizeof(bool)), vw2.ignore_linear))
    return "ignore_linear";

  if (vw1.redefine_some != vw2.redefine_some)
    return "redefine_some";

  if (vw1.redefine_some &&
      !equal(vw1.redefine, vw1.redefine + (sizeof(vw1.redefine) / sizeof(unsigned char)), vw2.redefine))
    return "redefine";

  if (vw1.add_constant != vw2.add_constant)
    return "add_constant";

  if (vw1.dictionary_path.size() != vw2.dictionary_path.size())
    return "dictionary_path size";

  if (!equal(vw1.dictionary_path.begin(), vw1.dictionary_path.end(), vw2.dictionary_path.begin()))
    return "dictionary_path";

  for (auto i = std::begin(vw1.interactions), j = std::begin(vw2.interactions); i != std::end(vw1.interactions);
       ++i, ++j)
    if (*i != *j)
      return "interaction mismatch";

  return nullptr;
}